

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Gia_ManPrintMappingStats(Gia_Man_t *p,char *pDumpFile)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *__ptr;
  Gia_Obj_t *pObj_00;
  int *piVar4;
  FILE *__stream;
  abctime aVar5;
  bool bVar6;
  float fVar7;
  FILE *pTable;
  int pFanins [3];
  int nMuxF;
  int Ave;
  int LevelMax;
  int nFanins;
  int nLuts;
  int nLutSize;
  int iFan;
  int k;
  int i;
  int *pLevels;
  Gia_Obj_t *pObj;
  char *pDumpFile_local;
  Gia_Man_t *p_local;
  
  nFanins = 0;
  LevelMax = 0;
  Ave = 0;
  nMuxF = 0;
  pFanins[2] = 0;
  pFanins[1] = 0;
  iVar1 = Gia_ManHasMapping(p);
  if (iVar1 != 0) {
    iVar1 = Gia_ManObjNum(p);
    __ptr = calloc((long)iVar1,4);
    for (iFan = 1; iVar1 = Gia_ManObjNum(p), iFan < iVar1; iFan = iFan + 1) {
      iVar1 = Gia_ObjIsLut(p,iFan);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjLutIsMux(p,iFan);
        if (iVar1 == 0) {
          LevelMax = LevelMax + 1;
          iVar1 = Gia_ObjLutSize(p,iFan);
          Ave = iVar1 + Ave;
          iVar1 = Gia_ObjLutSize(p,iFan);
          nFanins = Abc_MaxInt(nFanins,iVar1);
          for (nLutSize = 0; iVar1 = Gia_ObjLutSize(p,iFan), nLutSize < iVar1;
              nLutSize = nLutSize + 1) {
            piVar4 = Gia_ObjLutFanins(p,iFan);
            iVar1 = Abc_MaxInt(*(int *)((long)__ptr + (long)iFan * 4),
                               *(int *)((long)__ptr + (long)piVar4[nLutSize] * 4));
            *(int *)((long)__ptr + (long)iFan * 4) = iVar1;
          }
          *(int *)((long)__ptr + (long)iFan * 4) = *(int *)((long)__ptr + (long)iFan * 4) + 1;
          nMuxF = Abc_MaxInt(nMuxF,*(int *)((long)__ptr + (long)iFan * 4));
        }
        else {
          iVar1 = Gia_ObjLutSize(p,iFan);
          if (iVar1 == 3) {
            pObj_00 = Gia_ManObj(p,iFan);
            Gia_ManPrintGetMuxFanins(p,pObj_00,(int *)&pTable);
            iVar1 = Abc_MaxInt(*(int *)((long)__ptr + (long)iFan * 4),
                               *(int *)((long)__ptr + (long)(int)pTable * 4) + 1);
            *(int *)((long)__ptr + (long)iFan * 4) = iVar1;
            iVar1 = Abc_MaxInt(*(int *)((long)__ptr + (long)iFan * 4),
                               *(int *)((long)__ptr + (long)pTable._4_4_ * 4));
            *(int *)((long)__ptr + (long)iFan * 4) = iVar1;
            iVar1 = Abc_MaxInt(*(int *)((long)__ptr + (long)iFan * 4),
                               *(int *)((long)__ptr + (long)pFanins[0] * 4));
            *(int *)((long)__ptr + (long)iFan * 4) = iVar1;
          }
          else {
            iVar1 = Gia_ObjLutSize(p,iFan);
            if (iVar1 == 2) {
              pLevels = (int *)Gia_ManObj(p,iFan);
              iVar1 = *(int *)((long)__ptr + (long)iFan * 4);
              iVar2 = Gia_ObjFaninId0((Gia_Obj_t *)pLevels,iFan);
              iVar1 = Abc_MaxInt(iVar1,*(int *)((long)__ptr + (long)iVar2 * 4));
              *(int *)((long)__ptr + (long)iFan * 4) = iVar1;
              iVar1 = *(int *)((long)__ptr + (long)iFan * 4);
              iVar2 = Gia_ObjFaninId1((Gia_Obj_t *)pLevels,iFan);
              iVar1 = Abc_MaxInt(iVar1,*(int *)((long)__ptr + (long)iVar2 * 4));
              *(int *)((long)__ptr + (long)iFan * 4) = iVar1;
            }
          }
          nMuxF = Abc_MaxInt(nMuxF,*(int *)((long)__ptr + (long)iFan * 4));
          Ave = Ave + 1;
          pFanins[1] = pFanins[1] + 1;
        }
      }
    }
    iFan = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar6 = false;
      if (iFan < iVar1) {
        pLevels = (int *)Gia_ManCo(p,iFan);
        bVar6 = (Gia_Obj_t *)pLevels != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Gia_ObjFaninId0p(p,(Gia_Obj_t *)pLevels);
      pFanins[2] = *(int *)((long)__ptr + (long)iVar1 * 4) + pFanins[2];
      iFan = iFan + 1;
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    Abc_Print(1,"Mapping (K=%d)  :  ",(ulong)(uint)nFanins);
    Abc_Print(1,"%slut =%7d%s  ","\x1b[1;33m",(ulong)(uint)LevelMax,"\x1b[0m");
    Abc_Print(1,"%sedge =%8d%s  ","\x1b[1;32m",(ulong)(uint)Ave,"\x1b[0m");
    Abc_Print(1,"%slev =%5d%s ","\x1b[1;31m",(ulong)(uint)nMuxF,"\x1b[0m");
    fVar7 = (float)pFanins[2];
    iVar1 = Gia_ManCoNum(p);
    Abc_Print(1,"%s(%.2f)%s  ",(double)(fVar7 / (float)iVar1),"\x1b[1;31m","\x1b[0m");
    if ((p->pManTime != (void *)0x0) &&
       (iVar1 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar1 != 0)) {
      uVar3 = Gia_ManLutLevelWithBoxes(p);
      Abc_Print(1,"%slevB =%5d%s  ","\x1b[1;31m",(ulong)uVar3,"\x1b[0m");
    }
    iVar1 = Gia_ManObjNum(p);
    Abc_Print(1,"mem =%5.2f MB",((double)(iVar1 + LevelMax * 2 + Ave) * 4.0) / 1048576.0);
    Abc_Print(1,"\n");
    if (pFanins[1] != 0) {
      Gia_ManCountDupLut(p);
    }
    if (pDumpFile != (char *)0x0) {
      __stream = fopen(pDumpFile,"a+");
      iVar1 = strcmp(Gia_ManPrintMappingStats::FileNameOld,p->pName);
      if (iVar1 == 0) {
        fprintf(__stream," ");
        fprintf(__stream,"%d ",(ulong)(uint)LevelMax);
        uVar3 = Gia_ManLutLevelWithBoxes(p);
        fprintf(__stream,"%d ",(ulong)uVar3);
        aVar5 = Abc_Clock();
        fprintf(__stream,"%.2f",((double)(aVar5 - Gia_ManPrintMappingStats::clk) * 1.0) / 1000000.0)
        ;
        Gia_ManPrintMappingStats::clk = Abc_Clock();
      }
      else {
        sprintf(Gia_ManPrintMappingStats::FileNameOld,"%s",p->pName);
        fprintf(__stream,"\n");
        fprintf(__stream,"%s ",p->pName);
        fprintf(__stream," ");
        uVar3 = Gia_ManAndNum(p);
        fprintf(__stream,"%d ",(ulong)uVar3);
        fprintf(__stream,"%d ",(ulong)(uint)LevelMax);
        uVar3 = Gia_ManLutLevelWithBoxes(p);
        fprintf(__stream,"%d ",(ulong)uVar3);
        Gia_ManPrintMappingStats::clk = Abc_Clock();
      }
      fclose(__stream);
    }
  }
  return;
}

Assistant:

void Gia_ManPrintMappingStats( Gia_Man_t * p, char * pDumpFile )
{
    Gia_Obj_t * pObj;
    int * pLevels;
    int i, k, iFan, nLutSize = 0, nLuts = 0, nFanins = 0, LevelMax = 0, Ave = 0, nMuxF = 0;
    if ( !Gia_ManHasMapping(p) )
        return;
    pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, i )
    {
        if ( Gia_ObjLutIsMux(p, i) )
        {
            int pFanins[3];
            if ( Gia_ObjLutSize(p, i) == 3 )
            {
                Gia_ManPrintGetMuxFanins( p, Gia_ManObj(p, i), pFanins );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[pFanins[0]]+1 );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[pFanins[1]] );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[pFanins[2]] );
            }
            else if ( Gia_ObjLutSize(p, i) == 2 )
            {
                pObj = Gia_ManObj( p, i );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[Gia_ObjFaninId0(pObj, i)] );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[Gia_ObjFaninId1(pObj, i)] );
            }
            LevelMax = Abc_MaxInt( LevelMax, pLevels[i] );
            nFanins++;
            nMuxF++;
            continue;
        }
        nLuts++;
        nFanins += Gia_ObjLutSize(p, i);
        nLutSize = Abc_MaxInt( nLutSize, Gia_ObjLutSize(p, i) );
        Gia_LutForEachFanin( p, i, iFan, k )
            pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[iFan] );
        pLevels[i]++;
        LevelMax = Abc_MaxInt( LevelMax, pLevels[i] );
    }
    Gia_ManForEachCo( p, pObj, i )
        Ave += pLevels[Gia_ObjFaninId0p(p, pObj)];
    ABC_FREE( pLevels );

#ifdef WIN32
    {
    HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);
    Abc_Print( 1, "Mapping (K=%d)  :  ", nLutSize );
    SetConsoleTextAttribute( hConsole, 14 ); // yellow
    Abc_Print( 1, "lut =%7d  ",  nLuts );
    if ( nMuxF )
    Abc_Print( 1, "muxF =%7d  ",  nMuxF );
    SetConsoleTextAttribute( hConsole, 10 ); // green
    Abc_Print( 1, "edge =%8d  ", nFanins );
    SetConsoleTextAttribute( hConsole, 12 ); // red
    Abc_Print( 1, "lev =%5d ",   LevelMax );
    Abc_Print( 1, "(%.2f)  ",    (float)Ave / Gia_ManCoNum(p) );
//    Abc_Print( 1, "over =%5.1f %%  ", 100.0 * Gia_ManComputeOverlap(p) / Gia_ManAndNum(p) );
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t *)p->pManTime) )
        Abc_Print( 1, "levB =%5d  ", Gia_ManLutLevelWithBoxes(p) );
    SetConsoleTextAttribute( hConsole, 7 );  // normal
    Abc_Print( 1, "mem =%5.2f MB", 4.0*(Gia_ManObjNum(p) + 2*nLuts + nFanins)/(1<<20) );
    Abc_Print( 1, "\n" );
    }
#else
    Abc_Print( 1, "Mapping (K=%d)  :  ", nLutSize );
    Abc_Print( 1, "%slut =%7d%s  ",  "\033[1;33m", nLuts,    "\033[0m" );  // yellow
    Abc_Print( 1, "%sedge =%8d%s  ", "\033[1;32m", nFanins,  "\033[0m" );  // green
    Abc_Print( 1, "%slev =%5d%s ",   "\033[1;31m", LevelMax, "\033[0m" );  // red
    Abc_Print( 1, "%s(%.2f)%s  ",    "\033[1;31m", (float)Ave / Gia_ManCoNum(p), "\033[0m" );
//    Abc_Print( 1, "over =%5.1f %%  ", 100.0 * Gia_ManComputeOverlap(p) / Gia_ManAndNum(p) );
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t *)p->pManTime) )
        Abc_Print( 1, "%slevB =%5d%s  ", "\033[1;31m", Gia_ManLutLevelWithBoxes(p), "\033[0m" );
    Abc_Print( 1, "mem =%5.2f MB", 4.0*(Gia_ManObjNum(p) + 2*nLuts + nFanins)/(1<<20) );
    Abc_Print( 1, "\n" );
#endif

    if ( nMuxF )
        Gia_ManCountDupLut( p );

    //return;
    if ( pDumpFile )
    {
        static char FileNameOld[1000] = {0};
        static abctime clk = 0;
        FILE * pTable = fopen( pDumpFile, "a+" );
        if ( strcmp( FileNameOld, p->pName ) )
        {
            sprintf( FileNameOld, "%s", p->pName );
            fprintf( pTable, "\n" );
            fprintf( pTable, "%s ", p->pName );
            fprintf( pTable, " " );
            fprintf( pTable, "%d ", Gia_ManAndNum(p) );
            fprintf( pTable, "%d ", nLuts           );
            fprintf( pTable, "%d ", Gia_ManLutLevelWithBoxes(p) );
            //fprintf( pTable, "%d ", Gia_ManRegBoxNum(p) );
            //fprintf( pTable, "%d ", Gia_ManNonRegBoxNum(p) );
            //fprintf( pTable, "%.2f", 1.0*(Abc_Clock() - clk)/CLOCKS_PER_SEC );
            clk = Abc_Clock();
        }
        else
        {
            //printf( "This part of the code is currently not used.\n" );
            //assert( 0 );
            fprintf( pTable, " " );
            fprintf( pTable, "%d ", nLuts           );
            fprintf( pTable, "%d ", Gia_ManLutLevelWithBoxes(p) );
            //fprintf( pTable, "%d ", Gia_ManRegBoxNum(p) );
            //fprintf( pTable, "%d ", Gia_ManNonRegBoxNum(p) );
            fprintf( pTable, "%.2f", 1.0*(Abc_Clock() - clk)/CLOCKS_PER_SEC );
            clk = Abc_Clock();
        }
        fclose( pTable );
    }

}